

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

bool __thiscall
wasm::analysis::Vector<wasm::RandomFullLattice>::join
          (Vector<wasm::RandomFullLattice> *this,Element *joinee,Element *joiner)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  
  if ((long)(joinee->
            super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(joinee->
            super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 4 != this->size) {
    __assert_fail("joinee.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x54,
                  "bool wasm::analysis::Vector<wasm::RandomFullLattice>::join(Element &, const Element &) const [L = wasm::RandomFullLattice]"
                 );
  }
  if ((long)(joiner->
            super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(joiner->
            super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 4 != this->size) {
    __assert_fail("joiner.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x55,
                  "bool wasm::analysis::Vector<wasm::RandomFullLattice>::join(Element &, const Element &) const [L = wasm::RandomFullLattice]"
                 );
  }
  if (this->size == 0) {
    bVar3 = false;
  }
  else {
    lVar4 = 0;
    uVar2 = 0;
    bVar3 = false;
    do {
      bVar1 = RandomFullLattice::join
                        (&this->lattice,
                         (Element *)
                         ((long)&(((joinee->
                                   super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                 super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar4),
                         (Element *)
                         ((long)&(((joiner->
                                   super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                 super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar4));
      bVar3 = (bool)(bVar3 | bVar1);
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar2 < this->size);
  }
  return bVar3;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    assert(joinee.size() == size);
    assert(joiner.size() == size);
    bool result = false;
    for (size_t i = 0; i < size; ++i) {
      result |= joinAtIndex(joinee, i, joiner[i]);
    }
    return result;
  }